

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::MergeFrom(DynamicMapField *this,MapFieldBase *other)

{
  pointer this_00;
  bool bVar1;
  int iVar2;
  CppType CVar3;
  int32_t value;
  uint32_t value_00;
  int value_01;
  LogMessage *other_00;
  undefined4 extraout_var;
  key_arg<google::protobuf::MapKey> *pkVar4;
  Descriptor *this_01;
  FieldDescriptor *this_02;
  int64_t value_02;
  uint64_t value_03;
  string *value_04;
  Message *pMVar5;
  const_pointer pvVar6;
  Message *pMVar7;
  float value_05;
  double value_06;
  FieldDescriptor *field_descriptor;
  pointer local_c8;
  MapValueRef *map_val;
  iterator iter;
  undefined1 local_90 [8];
  const_iterator other_it;
  DynamicMapField *other_field;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *map;
  byte local_51;
  LogMessage local_50;
  MapFieldBase *local_18;
  MapFieldBase *other_local;
  DynamicMapField *this_local;
  
  local_18 = other;
  other_local = (MapFieldBase *)this;
  bVar1 = MapFieldBase::IsMapValid((MapFieldBase *)this);
  local_51 = 0;
  if ((!bVar1) || (bVar1 = MapFieldBase::IsMapValid(local_18), !bVar1)) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
               ,0x165);
    local_51 = 1;
    other_00 = LogMessage::operator<<
                         (&local_50,"CHECK failed: IsMapValid() && other.IsMapValid(): ");
    LogFinisher::operator=((LogFinisher *)((long)&map + 3),other_00);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  iVar2 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x16])();
  other_it.it_.bucket_index_ = (size_type)local_18;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((const_iterator *)local_90,
             (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)(local_18 + 1));
  while( true ) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((const_iterator *)&iter.it_.bucket_index_,
               (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               (other_it.it_.bucket_index_ + 0x48));
    bVar1 = protobuf::operator!=
                      ((const_iterator *)local_90,(const_iterator *)&iter.it_.bucket_index_);
    if (!bVar1) break;
    pkVar4 = (key_arg<google::protobuf::MapKey> *)
             Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
             operator->((const_iterator *)local_90);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find<google::protobuf::MapKey>
              ((iterator *)&map_val,
               (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               CONCAT44(extraout_var,iVar2),pkVar4);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              ((iterator *)&field_descriptor,
               (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               CONCAT44(extraout_var,iVar2));
    bVar1 = protobuf::operator==((iterator *)&map_val,(iterator *)&field_descriptor);
    if (bVar1) {
      pkVar4 = (key_arg<google::protobuf::MapKey> *)
               Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_90);
      local_c8 = (pointer)Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
                          operator[]<google::protobuf::MapKey>(&this->map_,pkVar4);
      AllocateMapValue(this,(MapValueRef *)local_c8);
    }
    else {
      local_c8 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                           ((iterator *)&map_val);
      local_c8 = local_c8 + 0x28;
    }
    this_01 = Message::GetDescriptor(this->default_entry_);
    this_02 = Descriptor::map_value(this_01);
    CVar3 = FieldDescriptor::cpp_type(this_02);
    this_00 = local_c8;
    switch(CVar3) {
    case CPPTYPE_INT32:
      pvVar6 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_90);
      value = MapValueConstRef::GetInt32Value((MapValueConstRef *)(pvVar6 + 0x28));
      MapValueRef::SetInt32Value((MapValueRef *)this_00,value);
      break;
    case CPPTYPE_INT64:
      pvVar6 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_90);
      value_02 = MapValueConstRef::GetInt64Value((MapValueConstRef *)(pvVar6 + 0x28));
      MapValueRef::SetInt64Value((MapValueRef *)this_00,value_02);
      break;
    case CPPTYPE_UINT32:
      pvVar6 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_90);
      value_00 = MapValueConstRef::GetUInt32Value((MapValueConstRef *)(pvVar6 + 0x28));
      MapValueRef::SetUInt32Value((MapValueRef *)this_00,value_00);
      break;
    case CPPTYPE_UINT64:
      pvVar6 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_90);
      value_03 = MapValueConstRef::GetUInt64Value((MapValueConstRef *)(pvVar6 + 0x28));
      MapValueRef::SetUInt64Value((MapValueRef *)this_00,value_03);
      break;
    case CPPTYPE_DOUBLE:
      pvVar6 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_90);
      value_06 = MapValueConstRef::GetDoubleValue((MapValueConstRef *)(pvVar6 + 0x28));
      MapValueRef::SetDoubleValue((MapValueRef *)this_00,value_06);
      break;
    case CPPTYPE_FLOAT:
      pvVar6 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_90);
      value_05 = MapValueConstRef::GetFloatValue((MapValueConstRef *)(pvVar6 + 0x28));
      MapValueRef::SetFloatValue((MapValueRef *)this_00,value_05);
      break;
    case CPPTYPE_BOOL:
      pvVar6 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_90);
      bVar1 = MapValueConstRef::GetBoolValue((MapValueConstRef *)(pvVar6 + 0x28));
      MapValueRef::SetBoolValue((MapValueRef *)this_00,bVar1);
      break;
    case CPPTYPE_ENUM:
      pvVar6 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_90);
      value_01 = MapValueConstRef::GetEnumValue((MapValueConstRef *)(pvVar6 + 0x28));
      MapValueRef::SetEnumValue((MapValueRef *)this_00,value_01);
      break;
    case CPPTYPE_STRING:
      pvVar6 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_90);
      value_04 = MapValueConstRef::GetStringValue_abi_cxx11_((MapValueConstRef *)(pvVar6 + 0x28));
      MapValueRef::SetStringValue((MapValueRef *)this_00,value_04);
      break;
    case CPPTYPE_MESSAGE:
      pMVar5 = MapValueRef::MutableMessageValue((MapValueRef *)local_c8);
      pvVar6 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)local_90);
      pMVar7 = MapValueConstRef::GetMessageValue((MapValueConstRef *)(pvVar6 + 0x28));
      (*(pMVar5->super_MessageLite)._vptr_MessageLite[0xd])(pMVar5,pMVar7);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator++
              ((const_iterator *)local_90);
  }
  return;
}

Assistant:

void DynamicMapField::MergeFrom(const MapFieldBase& other) {
  GOOGLE_DCHECK(IsMapValid() && other.IsMapValid());
  Map<MapKey, MapValueRef>* map = MutableMap();
  const DynamicMapField& other_field =
      reinterpret_cast<const DynamicMapField&>(other);
  for (Map<MapKey, MapValueRef>::const_iterator other_it =
           other_field.map_.begin();
       other_it != other_field.map_.end(); ++other_it) {
    Map<MapKey, MapValueRef>::iterator iter = map->find(other_it->first);
    MapValueRef* map_val;
    if (iter == map->end()) {
      map_val = &map_[other_it->first];
      AllocateMapValue(map_val);
    } else {
      map_val = &iter->second;
    }

    // Copy map value
    const FieldDescriptor* field_descriptor =
        default_entry_->GetDescriptor()->map_value();
    switch (field_descriptor->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        map_val->SetInt32Value(other_it->second.GetInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        map_val->SetInt64Value(other_it->second.GetInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        map_val->SetUInt32Value(other_it->second.GetUInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        map_val->SetUInt64Value(other_it->second.GetUInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_FLOAT: {
        map_val->SetFloatValue(other_it->second.GetFloatValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_DOUBLE: {
        map_val->SetDoubleValue(other_it->second.GetDoubleValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_BOOL: {
        map_val->SetBoolValue(other_it->second.GetBoolValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        map_val->SetStringValue(other_it->second.GetStringValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_ENUM: {
        map_val->SetEnumValue(other_it->second.GetEnumValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        map_val->MutableMessageValue()->CopyFrom(
            other_it->second.GetMessageValue());
        break;
      }
    }
  }
}